

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_with_color.c
# Opt level: O2

bool_t prf_vertex_with_color_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  float64_t *pfVar1;
  uint uVar2;
  ushort uVar3;
  uint len;
  bool_t bVar4;
  
  if (node->opcode == prf_vertex_with_color_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    pfVar1 = (float64_t *)node->data;
    bf_put_uint16_be(bfile,*(uint16_t *)(pfVar1 + 3));
    bf_put_uint16_be(bfile,*(uint16_t *)((long)pfVar1 + 0x1a));
    bf_put_float64_be(bfile,*pfVar1);
    bf_put_float64_be(bfile,pfVar1[1]);
    bf_put_float64_be(bfile,pfVar1[2]);
    uVar3 = node->length;
    if (uVar3 < 0x24) {
      uVar2 = 0x20;
    }
    else {
      bf_put_uint32_be(bfile,*(uint32_t *)((long)pfVar1 + 0x1c));
      uVar3 = node->length;
      if (uVar3 < 0x28) {
        uVar2 = 0x24;
      }
      else {
        bf_put_uint32_be(bfile,*(uint32_t *)(pfVar1 + 4));
        uVar3 = node->length;
        uVar2 = 0x28;
      }
    }
    bVar4 = 1;
    len = uVar3 - uVar2;
    if (uVar2 <= uVar3 && len != 0) {
      bf_write(bfile,node->data + ((ulong)uVar2 - 4),len);
    }
  }
  else {
    bVar4 = 0;
    prf_error(9,"tried vertex with color save method on node of type %d.");
  }
  return bVar4;
}

Assistant:

static
bool_t
prf_vertex_with_color_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_vertex_with_color_info.opcode ) {
        prf_error( 9, "tried vertex with color save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    do {
        node_data * data = (node_data *) node->data;
        assert( data != NULL );
        bf_put_uint16_be( bfile, data->color_name_index ); pos += 2;
        bf_put_uint16_be( bfile, data->flags ); pos += 2;
        bf_put_float64_be( bfile, prf_dblread( data->x ) ); pos += 8;
        bf_put_float64_be( bfile, prf_dblread( data->y ) ); pos += 8;
        bf_put_float64_be( bfile, prf_dblread( data->z ) ); pos += 8;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->packed_color ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->color_index ); pos += 4;
    } while ( FALSE );

    if ( pos < node->length ) /* padding */
        pos += bf_write( bfile, node->data + pos - 4, node->length - pos );

    return TRUE;
}